

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeEmpty(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp)

{
  fpclass_type *pfVar1;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  undefined8 *puVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined8 uVar5;
  int *piVar6;
  SPxOut *pSVar7;
  char cVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  EmptyConstraintPS *pEVar12;
  pointer pnVar13;
  FixVariablePS *this_01;
  long lVar14;
  uint *puVar15;
  uint *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  ulong uVar20;
  int32_t iVar21;
  long lVar22;
  int iVar23;
  fpclass_type fVar24;
  long in_FS_OFFSET;
  byte bVar25;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr2;
  undefined1 local_888 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_880;
  uint local_878 [23];
  undefined3 uStack_81b;
  uint uStack_818;
  bool bStack_814;
  undefined8 local_810;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_808;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_800;
  uint local_7f8 [27];
  undefined3 uStack_78b;
  int iStack_788;
  undefined1 uStack_784;
  undefined8 local_780;
  shared_ptr<soplex::Tolerances> local_778;
  value_type local_768;
  shared_ptr<soplex::Tolerances> local_758;
  shared_ptr<soplex::Tolerances> local_748;
  double local_738;
  undefined8 uStack_730;
  undefined4 local_728;
  uint uStack_724;
  undefined4 uStack_720;
  undefined4 uStack_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined5 uStack_6b0;
  undefined3 uStack_6ab;
  undefined5 uStack_6a8;
  undefined8 local_6a0;
  cpp_dec_float<200U,_int,_void> local_698;
  cpp_dec_float<200U,_int,_void> local_618;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined5 uStack_530;
  undefined3 uStack_52b;
  undefined5 uStack_528;
  undefined8 local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_510;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_490;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_410;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_390;
  cpp_dec_float<200U,_int,_void> local_310;
  cpp_dec_float<200U,_int,_void> local_290;
  uint local_210 [28];
  uint local_1a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar25 = 0;
  lVar22 = (long)(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  iVar23 = 0;
  local_800 = this;
  if (0 < lVar22) {
    local_808 = &this->m_hist;
    uVar20 = lVar22 + 1;
    lVar22 = lVar22 * 0x40 + -4;
    iVar23 = 0;
    do {
      if ((lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[uVar20 - 2].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 0) {
        puVar2 = (undefined8 *)
                 ((long)(((lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar22 * 2);
        puVar16 = (uint *)(puVar2 + -0xf);
        pnVar19 = &local_410;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_410.m_backend.exp = *(int *)(puVar2 + -1);
        local_410.m_backend.neg = *(bool *)((long)puVar2 + -4);
        local_410.m_backend._120_8_ = *puVar2;
        local_520 = 0x1c00000000;
        local_598 = 0;
        uStack_590 = 0;
        local_588 = 0;
        uStack_580 = 0;
        local_578 = 0;
        uStack_570 = 0;
        local_568 = 0;
        uStack_560 = 0;
        local_558 = 0;
        uStack_550 = 0;
        local_548 = 0;
        uStack_540 = 0;
        local_538 = 0;
        uStack_530 = 0;
        uStack_52b = 0;
        uStack_528 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_598,0.0);
        feastol(&local_b0,this);
        bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           (&local_410,
                            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_598,&local_b0);
        if (bVar10) {
          return INFEASIBLE;
        }
        puVar2 = (undefined8 *)
                 ((long)(((lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar22 * 2);
        puVar16 = (uint *)(puVar2 + -0xf);
        puVar15 = local_1a0;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar15 = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
        }
        iVar11 = *(int *)(puVar2 + -1);
        uVar3 = *(undefined1 *)((long)puVar2 + -4);
        uVar5 = *puVar2;
        local_618.fpclass = cpp_dec_float_finite;
        local_618.prec_elem = 0x1c;
        local_618.data._M_elems[0] = 0;
        local_618.data._M_elems[1] = 0;
        local_618.data._M_elems[2] = 0;
        local_618.data._M_elems[3] = 0;
        local_618.data._M_elems[4] = 0;
        local_618.data._M_elems[5] = 0;
        local_618.data._M_elems[6] = 0;
        local_618.data._M_elems[7] = 0;
        local_618.data._M_elems[8] = 0;
        local_618.data._M_elems[9] = 0;
        local_618.data._M_elems[10] = 0;
        local_618.data._M_elems[0xb] = 0;
        local_618.data._M_elems[0xc] = 0;
        local_618.data._M_elems[0xd] = 0;
        local_618.data._M_elems[0xe] = 0;
        local_618.data._M_elems[0xf] = 0;
        local_618.data._M_elems[0x10] = 0;
        local_618.data._M_elems[0x11] = 0;
        local_618.data._M_elems[0x12] = 0;
        local_618.data._M_elems[0x13] = 0;
        local_618.data._M_elems[0x14] = 0;
        local_618.data._M_elems[0x15] = 0;
        local_618.data._M_elems[0x16] = 0;
        local_618.data._M_elems[0x17] = 0;
        local_618.data._M_elems[0x18] = 0;
        local_618.data._M_elems[0x19] = 0;
        local_618.data._M_elems._104_5_ = 0;
        local_618.data._M_elems[0x1b]._1_3_ = 0;
        local_618.exp = 0;
        local_618.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_618,0.0);
        feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_290,this);
        puVar16 = local_1a0;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_888;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar17->data)._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
        }
        uStack_818 = iVar11;
        bStack_814 = (bool)uVar3;
        local_810 = uVar5;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_888,&local_618);
        if ((((fpclass_type)local_810 != cpp_dec_float_NaN) &&
            (local_290.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_888,&local_290), 0 < iVar11)
           ) {
          return INFEASIBLE;
        }
        pEVar12 = (EmptyConstraintPS *)operator_new(0xb0);
        this = local_800;
        local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_800->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_800->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        EmptyConstraintPS::EmptyConstraintPS(pEVar12,lp,(int)(uVar20 - 2),&local_748);
        local_888 = (undefined1  [8])pEVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::EmptyConstraintPS*>
                  (&_Stack_880,pEVar12);
        if (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_748.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_808->data,(value_type *)local_888);
        piVar6 = (this->m_rIdx).data;
        piVar6[uVar20 - 2] =
             piVar6[(long)(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0xf])(lp,uVar20 - 2 & 0xffffffff);
        piVar6 = (this->m_stat).data;
        *piVar6 = *piVar6 + 1;
        if (_Stack_880._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_880._M_pi);
        }
        iVar23 = iVar23 + 1;
      }
      uVar20 = uVar20 - 1;
      lVar22 = lVar22 + -0x40;
    } while (1 < uVar20);
  }
  uVar20 = (ulong)(lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
  iVar11 = 0;
  if (0 < (long)uVar20) {
    local_738 = *(double *)(in_FS_OFFSET + -8);
    local_728 = SUB84(local_738,0);
    uStack_730 = 0;
    uStack_724 = (uint)((ulong)local_738 >> 0x20) ^ 0x80000000;
    uStack_720 = 0;
    uStack_71c = 0x80000000;
    this_00 = &this->m_hist;
    lVar22 = uVar20 << 7;
    iVar11 = 0;
    do {
      if ((lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.theitem
          [(lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thekey[uVar20 - 1].idx].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 0) {
        local_808 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(local_808._4_4_,iVar11);
        local_780 = 0x1c00000000;
        local_7f8[0] = 0;
        local_7f8[1] = 0;
        local_7f8[2] = 0;
        local_7f8[3] = 0;
        local_7f8[4] = 0;
        local_7f8[5] = 0;
        local_7f8[6] = 0;
        local_7f8[7] = 0;
        local_7f8[8] = 0;
        local_7f8[9] = 0;
        local_7f8[10] = 0;
        local_7f8[0xb] = 0;
        local_7f8[0xc] = 0;
        local_7f8[0xd] = 0;
        local_7f8[0xe] = 0;
        local_7f8[0xf] = 0;
        local_7f8[0x10] = 0;
        local_7f8[0x11] = 0;
        local_7f8[0x12] = 0;
        local_7f8[0x13] = 0;
        local_7f8[0x14] = 0;
        local_7f8[0x15] = 0;
        local_7f8[0x16] = 0;
        local_7f8[0x17] = 0;
        local_7f8[0x18] = 0;
        local_7f8[0x19] = 0;
        stack0xfffffffffffff870 = 0;
        uStack_78b = 0;
        iStack_788 = 0;
        uStack_784 = 0;
        puVar16 = (uint *)((long)(lp->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).object.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                 _M_elems + lVar22);
        puVar15 = puVar16;
        puVar18 = local_210;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar18 = *puVar15;
          puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
        }
        uVar4 = puVar16[0x1c];
        uVar9 = puVar16[0x1d];
        uVar5._0_4_ = puVar16[0x1e];
        uVar5._4_4_ = puVar16[0x1f];
        local_698.fpclass = cpp_dec_float_finite;
        local_698.prec_elem = 0x1c;
        local_698.data._M_elems[0] = 0;
        local_698.data._M_elems[1] = 0;
        local_698.data._M_elems[2] = 0;
        local_698.data._M_elems[3] = 0;
        local_698.data._M_elems[4] = 0;
        local_698.data._M_elems[5] = 0;
        local_698.data._M_elems[6] = 0;
        local_698.data._M_elems[7] = 0;
        local_698.data._M_elems[8] = 0;
        local_698.data._M_elems[9] = 0;
        local_698.data._M_elems[10] = 0;
        local_698.data._M_elems[0xb] = 0;
        local_698.data._M_elems[0xc] = 0;
        local_698.data._M_elems[0xd] = 0;
        local_698.data._M_elems[0xe] = 0;
        local_698.data._M_elems[0xf] = 0;
        local_698.data._M_elems[0x10] = 0;
        local_698.data._M_elems[0x11] = 0;
        local_698.data._M_elems[0x12] = 0;
        local_698.data._M_elems[0x13] = 0;
        local_698.data._M_elems[0x14] = 0;
        local_698.data._M_elems[0x15] = 0;
        local_698.data._M_elems[0x16] = 0;
        local_698.data._M_elems[0x17] = 0;
        local_698.data._M_elems[0x18] = 0;
        local_698.data._M_elems[0x19] = 0;
        local_698.data._M_elems._104_5_ = 0;
        local_698.data._M_elems[0x1b]._1_3_ = 0;
        local_698.exp = 0;
        local_698.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_698,0.0);
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_310,this);
        puVar16 = local_210;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_888;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar17->data)._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar25 * -8 + 4);
        }
        uStack_818 = uVar4;
        bStack_814 = (bool)(char)uVar9;
        local_810 = uVar5;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_888,&local_698);
        if ((((fpclass_type)local_810 == cpp_dec_float_NaN) ||
            (local_310.fpclass == cpp_dec_float_NaN)) ||
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               ((cpp_dec_float<200U,_int,_void> *)local_888,&local_310), iVar11 < 1)
           ) {
          pnVar13 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar16 = (uint *)((long)pnVar13[-1].m_backend.data._M_elems + lVar22);
          pnVar19 = &local_390;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = *puVar16;
            puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
          }
          local_390.m_backend.exp =
               *(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -0x10);
          local_390.m_backend.neg =
               *(bool *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -0xc);
          local_390.m_backend._120_8_ =
               *(undefined8 *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8);
          local_6a0 = 0x1c00000000;
          local_718 = 0;
          uStack_710 = 0;
          local_708 = 0;
          uStack_700 = 0;
          local_6f8 = 0;
          uStack_6f0 = 0;
          local_6e8 = 0;
          uStack_6e0 = 0;
          local_6d8 = 0;
          uStack_6d0 = 0;
          local_6c8 = 0;
          uStack_6c0 = 0;
          local_6b8 = 0;
          uStack_6b0 = 0;
          uStack_6ab = 0;
          uStack_6a8 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_718,0.0);
          epsZero(&local_130,local_800);
          bVar10 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_390,
                              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_718,&local_130);
          pnVar13 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)pnVar13[-1].m_backend.data._M_elems + lVar22);
          if (bVar10) {
            ::soplex::infinity::__tls_init();
            local_810._0_4_ = cpp_dec_float_finite;
            local_810._4_4_ = 0x1c;
            local_888 = (undefined1  [8])0x0;
            _Stack_880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_878[0] = 0;
            local_878[1] = 0;
            local_878[2] = 0;
            local_878[3] = 0;
            local_878[4] = 0;
            local_878[5] = 0;
            local_878[6] = 0;
            local_878[7] = 0;
            local_878[8] = 0;
            local_878[9] = 0;
            local_878[10] = 0;
            local_878[0xb] = 0;
            local_878[0xc] = 0;
            local_878[0xd] = 0;
            local_878[0xe] = 0;
            local_878[0xf] = 0;
            local_878[0x10] = 0;
            local_878[0x11] = 0;
            local_878[0x12] = 0;
            local_878[0x13] = 0;
            local_878[0x14] = 0;
            local_878[0x15] = 0;
            stack0xfffffffffffff7e0 = 0;
            uStack_81b = 0;
            uStack_818 = 0;
            bStack_814 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_888,
                       (double)CONCAT44(uStack_724,local_728));
            if (((*(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8) != 2) &&
                ((fpclass_type)local_810 != cpp_dec_float_NaN)) &&
               (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar17,(cpp_dec_float<200U,_int,_void> *)local_888), iVar11 < 1
               )) {
              return UNBOUNDED;
            }
LAB_0057e434:
            pnVar13 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0057e43b;
          }
          ::soplex::infinity::__tls_init();
          local_810._0_4_ = cpp_dec_float_finite;
          local_810._4_4_ = 0x1c;
          local_888 = (undefined1  [8])0x0;
          _Stack_880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_878[0] = 0;
          local_878[1] = 0;
          local_878[2] = 0;
          local_878[3] = 0;
          local_878[4] = 0;
          local_878[5] = 0;
          local_878[6] = 0;
          local_878[7] = 0;
          local_878[8] = 0;
          local_878[9] = 0;
          local_878[10] = 0;
          local_878[0xb] = 0;
          local_878[0xc] = 0;
          local_878[0xd] = 0;
          local_878[0xe] = 0;
          local_878[0xf] = 0;
          local_878[0x10] = 0;
          local_878[0x11] = 0;
          local_878[0x12] = 0;
          local_878[0x13] = 0;
          local_878[0x14] = 0;
          local_878[0x15] = 0;
          stack0xfffffffffffff7e0 = 0;
          uStack_81b = 0;
          uStack_818 = 0;
          bStack_814 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_888,
                     (double)CONCAT44(uStack_724,local_728));
          if (((*(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8) != 2) &&
              ((fpclass_type)local_810 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar17,(cpp_dec_float<200U,_int,_void> *)local_888), 0 < iVar11))
          goto LAB_0057e434;
          pnVar13 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_810._0_4_ = cpp_dec_float_finite;
          local_810._4_4_ = 0x1c;
          local_888 = (undefined1  [8])0x0;
          _Stack_880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_878[0] = 0;
          local_878[1] = 0;
          local_878[2] = 0;
          local_878[3] = 0;
          local_878[4] = 0;
          local_878[5] = 0;
          local_878[6] = 0;
          local_878[7] = 0;
          local_878[8] = 0;
          local_878[9] = 0;
          local_878[10] = 0;
          local_878[0xb] = 0;
          local_878[0xc] = 0;
          local_878[0xd] = 0;
          local_878[0xe] = 0;
          local_878[0xf] = 0;
          local_878[0x10] = 0;
          local_878[0x11] = 0;
          local_878[0x12] = 0;
          local_878[0x13] = 0;
          local_878[0x14] = 0;
          local_878[0x15] = 0;
          stack0xfffffffffffff7e0 = 0;
          uStack_81b = 0;
          uStack_818 = 0;
          bStack_814 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_888,local_738);
          if (((*(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8) != 2) &&
              ((fpclass_type)local_810 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)pnVar13[-1].m_backend.data._M_elems + lVar22),
                                  (cpp_dec_float<200U,_int,_void> *)local_888), iVar11 < 0)) {
            pnVar13 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0057e43b;
          }
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_7f8,0.0);
          fVar24 = (fpclass_type)local_780;
          iVar21 = local_780._4_4_;
        }
        else {
          pnVar13 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_810._0_4_ = cpp_dec_float_finite;
          local_810._4_4_ = 0x1c;
          local_888 = (undefined1  [8])0x0;
          _Stack_880._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_878[0] = 0;
          local_878[1] = 0;
          local_878[2] = 0;
          local_878[3] = 0;
          local_878[4] = 0;
          local_878[5] = 0;
          local_878[6] = 0;
          local_878[7] = 0;
          local_878[8] = 0;
          local_878[9] = 0;
          local_878[10] = 0;
          local_878[0xb] = 0;
          local_878[0xc] = 0;
          local_878[0xd] = 0;
          local_878[0xe] = 0;
          local_878[0xf] = 0;
          local_878[0x10] = 0;
          local_878[0x11] = 0;
          local_878[0x12] = 0;
          local_878[0x13] = 0;
          local_878[0x14] = 0;
          local_878[0x15] = 0;
          stack0xfffffffffffff7e0 = 0;
          uStack_81b = 0;
          uStack_818 = 0;
          bStack_814 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_888,local_738);
          if (((*(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8) != 2) &&
              ((fpclass_type)local_810 != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)
                                  ((long)pnVar13[-1].m_backend.data._M_elems + lVar22),
                                  (cpp_dec_float<200U,_int,_void> *)local_888), -1 < iVar11)) {
            return UNBOUNDED;
          }
          pnVar13 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_0057e43b:
          puVar16 = (uint *)((long)pnVar13[-1].m_backend.data._M_elems + lVar22);
          puVar15 = local_7f8;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar15 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar25 * -2 + 1;
          }
          iStack_788 = *(int *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -0x10);
          uStack_784 = *(undefined1 *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -0xc);
          pfVar1 = (fpclass_type *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -8);
          local_780 = *(undefined8 *)pfVar1;
          fVar24 = *pfVar1;
          iVar21 = *(int32_t *)((long)(pnVar13->m_backend).data._M_elems + lVar22 + -4);
        }
        uVar3 = uStack_784;
        iVar11 = iStack_788;
        pEVar12 = (EmptyConstraintPS *)operator_new(0x30);
        this = local_800;
        puVar16 = local_7f8;
        pnVar19 = &local_510;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_510.m_backend.exp = iVar11;
        local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_800->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_800->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        iVar11 = (int)(uVar20 - 1);
        local_510.m_backend.neg = (bool)uVar3;
        local_510.m_backend.fpclass = fVar24;
        local_510.m_backend.prec_elem = iVar21;
        FixBoundsPS::FixBoundsPS((FixBoundsPS *)pEVar12,lp,iVar11,&local_510,&local_758);
        local_888 = (undefined1  [8])pEVar12;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                  (&_Stack_880,(FixBoundsPS *)pEVar12);
        if (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_758.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_01 = (FixVariablePS *)operator_new(600);
        puVar16 = local_7f8;
        pnVar19 = &local_490;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = *puVar16;
          puVar16 = puVar16 + (ulong)bVar25 * -2 + 1;
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
        }
        local_490.m_backend.exp = iStack_788;
        local_490.m_backend.neg = (bool)uStack_784;
        local_490.m_backend.fpclass = (fpclass_type)local_780;
        local_490.m_backend.prec_elem = local_780._4_4_;
        local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        FixVariablePS::FixVariablePS(this_01,lp,this,iVar11,&local_490,&local_778,true);
        local_768.
        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixVariablePS*>
                  (&local_768.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,this_01);
        if (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_778.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&this_00->data,(value_type *)local_888);
        iVar11 = (int)local_808;
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&this_00->data,&local_768);
        piVar6 = (this->m_cIdx).data;
        piVar6[uVar20 - 1] =
             piVar6[(long)(lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x15])(lp,uVar20 - 1 & 0xffffffff);
        piVar6 = (this->m_stat).data + 4;
        *piVar6 = *piVar6 + 1;
        if (local_768.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_768.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (_Stack_880._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_880._M_pi);
        }
        iVar11 = iVar11 + 1;
      }
      lVar22 = lVar22 + -0x80;
      bVar10 = 1 < uVar20;
      uVar20 = uVar20 - 1;
    } while (bVar10);
  }
  if (iVar11 + iVar23 != 0 && SCARRY4(iVar11,iVar23) == iVar11 + iVar23 < 0) {
    piVar6 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_remRows;
    *piVar6 = *piVar6 + iVar23;
    piVar6 = &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_remCols;
    *piVar6 = *piVar6 + iVar11;
    pSVar7 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    if (pSVar7 != (SPxOut *)0x0) {
      if (3 < (int)pSVar7->m_verbosity) {
        local_888._0_4_ = pSVar7->m_verbosity;
        local_7f8[0] = 4;
        (*pSVar7->_vptr_SPxOut[2])();
        pSVar7 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar7->m_streams[pSVar7->m_verbosity],"Simplifier (empty rows/colums) removed ",
                   0x27);
        std::ostream::operator<<((ostream *)pSVar7->m_streams[pSVar7->m_verbosity],iVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar7->m_streams[pSVar7->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar7->m_streams[pSVar7->m_verbosity],iVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar7->m_streams[pSVar7->m_verbosity]," cols",5);
        cVar8 = (char)pSVar7->m_streams[pSVar7->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar7->m_streams[pSVar7->m_verbosity] + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
        pSVar7 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        (*pSVar7->_vptr_SPxOut[2])(pSVar7,local_888);
        return OKAY;
      }
      return OKAY;
    }
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeEmpty(SPxLPBase<R>& lp)
{

   // This method removes empty rows and columns from the LP.

   int remRows = 0;
   int remCols = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 0)
      {
         SPxOut::debug(this, "IMAISM07 row {}: empty ->", i);

         if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
         {
            SPxOut::debug(this, " infeasible lhs={} rhs={}\n", lp.lhs(i), lp.rhs(i));
            return this->INFEASIBLE;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr(new EmptyConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         removeRow(lp, i);

         ++m_stat[EMPTY_ROW];
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      if(col.size() == 0)
      {
         SPxOut::debug(this, "IMAISM08 col {}: empty -> maxObj={} lower={} upper={}", j, lp.maxObj(j),
                       lp.lower(j), lp.upper(j));

         R val;

         if(GT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.upper(j) >= R(infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.upper(j);
         }
         else if(LT(lp.maxObj(j), R(0.0), this->epsZero()))
         {
            if(lp.lower(j) <= R(-infinity))
            {
               SPxOut::debug(this, " unbounded\n");
               return this->UNBOUNDED;
            }

            val = lp.lower(j);
         }
         else
         {
            SOPLEX_ASSERT_WARN("WMAISM09", isZero(lp.maxObj(j), this->epsZero()));

            // any value within the bounds is ok
            if(lp.lower(j) > R(-infinity))
               val = lp.lower(j);
            else if(lp.upper(j) < R(infinity))
               val = lp.upper(j);
            else
               val = 0.0;
         }

         SPxOut::debug(this, " removed\n");

         std::shared_ptr<PostStep> ptr1(new FixBoundsPS(lp, j, val, this->_tolerances));
         std::shared_ptr<PostStep> ptr2(new FixVariablePS(lp, *this, j, val, this->_tolerances));
         m_hist.append(ptr1);
         m_hist.append(ptr2);

         ++remCols;
         removeCol(lp, j);

         ++m_stat[EMPTY_COL];
      }
   }

   if(remRows + remCols > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (empty rows/colums) removed "
                    << remRows << " rows, "
                    << remCols << " cols"
                    << std::endl;)

   }

   return this->OKAY;
}